

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

void __thiscall OpenMD::Snapshot::clearDerivedProperties(Snapshot *this)

{
  long in_RDI;
  SquareMatrix3<double> *in_stack_fffffffffffffed8;
  SquareMatrix3<double> *in_stack_fffffffffffffee0;
  SquareMatrix3<double> *this_00;
  double (*x) [3];
  Vector3<double> *this_01;
  Vector3<double> local_e0 [3];
  double local_98;
  SquareMatrix3<double> local_90 [2];
  
  *(undefined8 *)(in_RDI + 0x678) = 0;
  *(undefined8 *)(in_RDI + 0x680) = 0;
  *(undefined8 *)(in_RDI + 0x688) = 0;
  *(undefined8 *)(in_RDI + 0x690) = 0;
  *(undefined8 *)(in_RDI + 0x698) = 0;
  *(undefined8 *)(in_RDI + 0x6a0) = 0;
  *(undefined8 *)(in_RDI + 0x6a8) = 0;
  *(undefined8 *)(in_RDI + 0x6b0) = 0;
  *(undefined8 *)(in_RDI + 0x760) = 0;
  *(undefined8 *)(in_RDI + 0x720) = 0;
  *(undefined8 *)(in_RDI + 0x808) = 0;
  *(undefined8 *)(in_RDI + 0x810) = 0;
  SquareMatrix3<double>::SquareMatrix3(in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8);
  SquareMatrix3<double>::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1f7c6a);
  local_98 = 0.0;
  this_00 = local_90;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)this_00,&local_98);
  x = local_90[0].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ + 1;
  Vector3<double>::Vector3
            ((Vector3<double> *)this_00,(Vector<double,_3U> *)in_stack_fffffffffffffed8);
  Vector3<double>::operator=
            ((Vector3<double> *)this_00,(Vector3<double> *)in_stack_fffffffffffffed8);
  this_01 = local_e0;
  SquareMatrix3<double>::SquareMatrix3(this_00,(double)in_stack_fffffffffffffed8);
  SquareMatrix3<double>::operator=(this_00,in_stack_fffffffffffffed8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1f7cf1);
  Vector3<double>::Vector3(this_01,(double)x,(double)this_00,(double)in_stack_fffffffffffffed8);
  Vector3<double>::operator=
            ((Vector3<double> *)this_00,(Vector3<double> *)in_stack_fffffffffffffed8);
  *(undefined8 *)(in_RDI + 0x828) = 0;
  *(undefined8 *)(in_RDI + 0x830) = 0;
  *(undefined8 *)(in_RDI + 0x838) = 0;
  Vector3<double>::operator=
            ((Vector3<double> *)this_00,(Vector3<double> *)in_stack_fffffffffffffed8);
  Vector3<double>::operator=
            ((Vector3<double> *)this_00,(Vector3<double> *)in_stack_fffffffffffffed8);
  Vector3<double>::operator=
            ((Vector3<double> *)this_00,(Vector3<double> *)in_stack_fffffffffffffed8);
  *(undefined1 *)(in_RDI + 0xa70) = 0;
  *(undefined1 *)(in_RDI + 0xa71) = 0;
  *(undefined1 *)(in_RDI + 0xa72) = 0;
  *(undefined1 *)(in_RDI + 0xa73) = 0;
  *(undefined1 *)(in_RDI + 0xa74) = 0;
  *(undefined1 *)(in_RDI + 0xa75) = 0;
  *(undefined1 *)(in_RDI + 0xa76) = 0;
  *(undefined1 *)(in_RDI + 0xa77) = 0;
  *(undefined1 *)(in_RDI + 0xa78) = 0;
  *(undefined1 *)(in_RDI + 0xa79) = 0;
  *(undefined1 *)(in_RDI + 0xa7a) = 0;
  *(undefined1 *)(in_RDI + 0xa7b) = 0;
  *(undefined1 *)(in_RDI + 0xa7c) = 0;
  *(undefined1 *)(in_RDI + 0xa7d) = 0;
  *(undefined1 *)(in_RDI + 0xa7e) = 0;
  *(undefined1 *)(in_RDI + 0xa7f) = 0;
  *(undefined1 *)(in_RDI + 0xa80) = 0;
  *(undefined1 *)(in_RDI + 0xa81) = 0;
  *(undefined1 *)(in_RDI + 0xa82) = 0;
  *(undefined1 *)(in_RDI + 0xa83) = 0;
  *(undefined1 *)(in_RDI + 0xa84) = 0;
  *(undefined1 *)(in_RDI + 0xa85) = 0;
  *(undefined1 *)(in_RDI + 0xa86) = 0;
  *(undefined1 *)(in_RDI + 0xa87) = 0;
  *(undefined1 *)(in_RDI + 0xa88) = 0;
  *(undefined1 *)(in_RDI + 0xa89) = 0;
  *(undefined1 *)(in_RDI + 0xa8a) = 0;
  *(undefined1 *)(in_RDI + 0xa8b) = 0;
  *(undefined1 *)(in_RDI + 0xa8c) = 0;
  *(undefined1 *)(in_RDI + 0xa8d) = 0;
  return;
}

Assistant:

void Snapshot::clearDerivedProperties() {
    frameData.totalEnergy           = 0.0;
    frameData.translationalKinetic  = 0.0;
    frameData.rotationalKinetic     = 0.0;
    frameData.electronicKinetic     = 0.0;
    frameData.kineticEnergy         = 0.0;
    frameData.potentialEnergy       = 0.0;
    frameData.shortRangePotential   = 0.0;
    frameData.longRangePotential    = 0.0;
    frameData.excludedPotential     = 0.0;
    frameData.selfPotential         = 0.0;
    frameData.pressure              = 0.0;
    frameData.temperature           = 0.0;
    frameData.pressureTensor        = Mat3x3d(0.0);
    frameData.systemDipole          = Vector3d(0.0);
    frameData.systemQuadrupole      = Mat3x3d(0.0);
    frameData.convectiveHeatFlux    = Vector3d(0.0, 0.0, 0.0);
    frameData.electronicTemperature = 0.0;
    frameData.netCharge             = 0.0;
    frameData.chargeMomentum        = 0.0;
    frameData.COM                   = V3Zero;
    frameData.COMvel                = V3Zero;
    frameData.COMw                  = V3Zero;

    hasTotalEnergy                = false;
    hasTranslationalKineticEnergy = false;
    hasRotationalKineticEnergy    = false;
    hasElectronicKineticEnergy    = false;
    hasKineticEnergy              = false;
    hasShortRangePotential        = false;
    hasLongRangePotential         = false;
    hasExcludedPotential          = false;
    hasSelfPotential              = false;
    hasPotentialEnergy            = false;
    hasXYarea                     = false;
    hasXZarea                     = false;
    hasYZarea                     = false;
    hasVolume                     = false;
    hasPressure                   = false;
    hasTemperature                = false;
    hasElectronicTemperature      = false;
    hasNetCharge                  = false;
    hasChargeMomentum             = false;
    hasCOM                        = false;
    hasCOMvel                     = false;
    hasCOMw                       = false;
    hasPressureTensor             = false;
    hasSystemDipole               = false;
    hasSystemQuadrupole           = false;
    hasConvectiveHeatFlux         = false;
    hasInertiaTensor              = false;
    hasGyrationalVolume           = false;
    hasHullVolume                 = false;
    hasBoundingBox                = false;
  }